

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::BufferedOutputStream_&> __thiscall
kj::dynamicDowncastIfAvailable<kj::BufferedOutputStream,kj::OutputStream>
          (kj *this,OutputStream *from)

{
  undefined8 uVar1;
  
  uVar1 = __dynamic_cast(from,&OutputStream::typeinfo,&BufferedOutputStream::typeinfo,0);
  *(undefined8 *)this = uVar1;
  return (Maybe<kj::BufferedOutputStream_&>)(BufferedOutputStream *)this;
}

Assistant:

Maybe<To&> dynamicDowncastIfAvailable(From& from) {
  // If RTTI is disabled, always returns kj::none.  Otherwise, works like dynamic_cast.  Useful
  // in situations where dynamic_cast could allow an optimization, but isn't strictly necessary
  // for correctness.  It is highly recommended that you try to arrange all your dynamic_casts
  // this way, as a dynamic_cast that is necessary for correctness implies a flaw in the interface
  // design.

  // Force a compile error if To is not a subtype of From.  Cross-casting is rare; if it is needed
  // we should have a separate cast function like dynamicCrosscastIfAvailable().
  if (false) {
    kj::implicitCast<From*>(kj::implicitCast<To*>(nullptr));
  }

#if KJ_NO_RTTI
  return kj::none;
#else
  return dynamic_cast<To*>(&from);
#endif
}